

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

Var Js::ArrayBuffer::EntrySlice(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_13b32019_for_newObjectCreationFunction newObjectCreationFunction;
  bool bVar2;
  int iVar3;
  CallFlags e;
  uint uVar4;
  int iVar5;
  ScriptContext *this;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptLibrary *pJVar9;
  ArrayBuffer *this_00;
  RecyclableObject *pRVar10;
  RecyclableObject *pRVar11;
  JavascriptFunction *defaultConstructor_00;
  JavascriptFunction *instanceObj;
  ArrayBuffer *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong local_d8;
  undefined4 uStack_b4;
  Var newVar;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  JavascriptFunction *defaultConstructor;
  ArrayBuffer *newBuffer;
  ulong uStack_78;
  uint32 byteLength;
  int64 newLen;
  int64 end;
  int64 start;
  int64 len;
  ArrayBuffer *arrayBuffer;
  JavascriptLibrary *library;
  ArgumentReader args;
  Var *_argsVarArray;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  this = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(this);
  ThreadContext::ProbeStack(pTVar6,0xc00,this,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x202,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&library,(CallInfo *)&function_local,values);
  if (((ulong)library & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x204,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x206,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)&library,0);
  bVar2 = VarIs<Js::ArrayBuffer>(pvVar8);
  if (!bVar2) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ea1c,(PCWSTR)0x0);
  }
  pJVar9 = ScriptContext::GetLibrary(this);
  pvVar8 = Arguments::operator[]((Arguments *)&library,0);
  this_00 = VarTo<Js::ArrayBuffer>(pvVar8);
  bVar2 = ArrayBufferBase::IsDetached(&this_00->super_ArrayBufferBase);
  if (bVar2) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ebe5,L"ArrayBuffer.prototype.slice");
  }
  uStack_78 = (ulong)this_00->bufferLength;
  end = 0;
  if (1 < ((uint)library & 0xffffff)) {
    pvVar8 = Arguments::operator[]((Arguments *)&library,1);
    end = Js::JavascriptArray::GetIndexFromVar(pvVar8,uStack_78,this);
    newLen = uStack_78;
    if (2 < ((uint)library & 0xffffff)) {
      pRVar10 = (RecyclableObject *)Arguments::operator[]((Arguments *)&library,2);
      pRVar11 = JavascriptLibraryBase::GetUndefined(&pJVar9->super_JavascriptLibraryBase);
      if (pRVar10 != pRVar11) {
        pvVar8 = Arguments::operator[]((Arguments *)&library,2);
        newLen = Js::JavascriptArray::GetIndexFromVar(pvVar8,uStack_78,this);
      }
    }
    if (end < newLen) {
      local_d8 = newLen - end;
    }
    else {
      local_d8 = 0;
    }
    uStack_78 = local_d8;
  }
  if (0x7fffffff < (long)uStack_78) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x233,"(newLen <= MaxArrayBufferLength)",
                                "newLen <= MaxArrayBufferLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar4 = (uint)uStack_78;
  pJVar9 = ScriptContext::GetLibrary(this);
  defaultConstructor_00 =
       JavascriptLibraryBase::GetArrayBufferConstructor(&pJVar9->super_JavascriptLibraryBase);
  instanceObj = (JavascriptFunction *)
                Js::JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)this_00,defaultConstructor_00,this);
  bVar2 = Js::JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x23a,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pTVar6 = ScriptContext::GetThreadContext(this);
  newObjectCreationFunction._12_4_ = uStack_b4;
  newObjectCreationFunction.byteLength = uVar4;
  newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
  newObjectCreationFunction.scriptContext = this;
  pvVar8 = Js::JavascriptOperators::
           NewObjectCreationHelper_ReentrancySafe<Js::ArrayBuffer::EntrySlice(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                     ((RecyclableObject *)instanceObj,instanceObj == defaultConstructor_00,pTVar6,
                      newObjectCreationFunction);
  bVar2 = VarIs<Js::ArrayBuffer>(pvVar8);
  if (!bVar2) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ea1c,(PCWSTR)0x0);
  }
  this_01 = VarTo<Js::ArrayBuffer>(pvVar8);
  bVar2 = ArrayBufferBase::IsDetached(&this_01->super_ArrayBufferBase);
  if (bVar2) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ebe5,L"ArrayBuffer.prototype.slice");
  }
  if (this_01 == this_00) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ea1c,(PCWSTR)0x0);
  }
  if (this_01->bufferLength < uVar4) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ebf6,L"ArrayBuffer.prototype.slice");
  }
  if (this_01 == (ArrayBuffer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x25a,"(newBuffer)","newBuffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this_01->bufferLength < uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x25b,"(newBuffer->bufferLength >= byteLength)",
                                "newBuffer->bufferLength >= byteLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = ArrayBufferBase::IsDetached(&this_00->super_ArrayBufferBase);
  if (bVar2) {
    JavascriptError::ThrowTypeError(this,-0x7ff5ebe5,L"ArrayBuffer.prototype.slice");
  }
  if (uVar4 != 0) {
    iVar3 = (*(this_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                  ,0x265,"(arrayBuffer->GetBuffer() != nullptr)",
                                  "buffer must not be null when we copy from it");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    iVar3 = (*(this_01->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    iVar5 = (*(this_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    js_memcpy_s((void *)CONCAT44(extraout_var_00,iVar3),uStack_78 & 0xffffffff,
                (void *)(CONCAT44(extraout_var_01,iVar5) + end),uStack_78 & 0xffffffff);
  }
  return this_01;
}

Assistant:

Var ArrayBuffer::EntrySlice(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (!VarIs<ArrayBuffer>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        ArrayBuffer* arrayBuffer = VarTo<ArrayBuffer>(args[0]);

        if (arrayBuffer->IsDetached()) // 24.1.4.3: 5. If IsDetachedBuffer(O) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("ArrayBuffer.prototype.slice"));
        }

        int64 len = arrayBuffer->bufferLength;
        int64 start = 0, end = 0;
        int64 newLen;

        // If no start or end arguments, use the entire length
        if (args.Info.Count < 2)
        {
            newLen = len;
        }
        else
        {
            start = JavascriptArray::GetIndexFromVar(args[1], len, scriptContext);

            // If no end argument, use length as the end
            if (args.Info.Count < 3 || args[2] == library->GetUndefined())
            {
                end = len;
            }
            else
            {
                end = JavascriptArray::GetIndexFromVar(args[2], len, scriptContext);
            }

            newLen = end > start ? end - start : 0;
        }

        // We can't have allocated an ArrayBuffer with byteLength > MaxArrayBufferLength.
        // start and end are clamped to valid indices, so the new length also cannot exceed MaxArrayBufferLength.
        // Therefore, should be safe to cast down newLen to uint32.
        // TODO: If we ever support allocating ArrayBuffer with byteLength > MaxArrayBufferLength we may need to review this math.
        Assert(newLen <= MaxArrayBufferLength);
        uint32 byteLength = static_cast<uint32>(newLen);

        ArrayBuffer* newBuffer = nullptr;

        JavascriptFunction* defaultConstructor = scriptContext->GetLibrary()->GetArrayBufferConstructor();
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(arrayBuffer, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        Js::Var newVar = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
        {
            Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(byteLength, scriptContext) };
            Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
            return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
        });

        if (!VarIs<ArrayBuffer>(newVar)) // 24.1.4.3: 19.If new does not have an [[ArrayBufferData]] internal slot throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }

        newBuffer = VarTo<ArrayBuffer>(newVar);

        if (newBuffer->IsDetached()) // 24.1.4.3: 21. If IsDetachedBuffer(new) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("ArrayBuffer.prototype.slice"));
        }

        if (newBuffer == arrayBuffer) // 24.1.4.3: 22. If SameValue(new, O) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }

        if (newBuffer->bufferLength < byteLength) // 24.1.4.3: 23.If the value of new's [[ArrayBufferByteLength]] internal slot < newLen, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ArgumentOutOfRange, _u("ArrayBuffer.prototype.slice"));
        }

        Assert(newBuffer);
        Assert(newBuffer->bufferLength >= byteLength);

        if (arrayBuffer->IsDetached()) // 24.1.4.3: 24. NOTE: Side-effects of the above steps may have detached O. 25. If IsDetachedBuffer(O) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("ArrayBuffer.prototype.slice"));
        }

        // Don't bother doing memcpy if we aren't copying any elements
        if (byteLength > 0)
        {
            AssertMsg(arrayBuffer->GetBuffer() != nullptr, "buffer must not be null when we copy from it");

            js_memcpy_s(newBuffer->GetBuffer(), byteLength, arrayBuffer->GetBuffer() + start, byteLength);
        }

        return newBuffer;
    }